

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableCornerButton::paintEvent(QTableCornerButton *this,QPaintEvent *param_2)

{
  long lVar1;
  bool bVar2;
  QStyle *pQVar3;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QPainter painter;
  State state;
  QStyleOptionHeader opt;
  undefined8 in_stack_ffffffffffffff28;
  StateFlag flags;
  QWidget *this_00;
  QAbstractButton *in_stack_ffffffffffffff30;
  QStyleOptionHeader *this_01;
  QStyleOption *this_02;
  undefined1 *local_b0;
  QRect local_a4;
  QFlagsStorage<QStyle::StateFlag> local_94;
  undefined1 local_90 [8];
  QFlagsStorage<QStyle::StateFlag> in_stack_ffffffffffffff78;
  LayoutDirection in_stack_ffffffffffffff7c;
  
  flags = (StateFlag)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  memset(local_90,0xaa,0x88);
  QStyleOptionHeader::QStyleOptionHeader((QStyleOptionHeader *)0x8c625e);
  QStyleOption::initFrom(this_02,in_RSI);
  local_94.i = 0xaaaaaaaa;
  QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff30,flags);
  bVar2 = QWidget::isEnabled((QWidget *)0x8c628d);
  if (bVar2) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_94,State_Enabled);
  }
  bVar2 = QWidget::isActiveWindow
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78.i));
  if (bVar2) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_94,State_Active);
  }
  bVar2 = QAbstractButton::isDown(in_stack_ffffffffffffff30);
  if (bVar2) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_94,State_Sunken);
  }
  local_a4 = QWidget::rect((QWidget *)this_02);
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)&local_b0;
  QPainter::QPainter((QPainter *)this_00,(QPaintDevice *)&in_RDI->rect);
  pQVar3 = QWidget::style(this_00);
  this_01 = (QStyleOptionHeader *)local_90;
  (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x17,this_01,this_00,in_RDI);
  QPainter::~QPainter((QPainter *)this_00);
  QStyleOptionHeader::~QStyleOptionHeader(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void paintEvent(QPaintEvent*) override {
        QStyleOptionHeader opt;
        opt.initFrom(this);
        QStyle::State state = QStyle::State_None;
        if (isEnabled())
            state |= QStyle::State_Enabled;
        if (isActiveWindow())
            state |= QStyle::State_Active;
        if (isDown())
            state |= QStyle::State_Sunken;
        opt.state = state;
        opt.rect = rect();
        opt.position = QStyleOptionHeader::OnlyOneSection;
        QPainter painter(this);
        style()->drawControl(QStyle::CE_Header, &opt, &painter, this);
    }